

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

void PutQuant(VP8BitWriter *bw,VP8Encoder *enc)

{
  VP8BitWriter *in_RSI;
  int in_stack_ffffffffffffffe8;
  uint32_t in_stack_ffffffffffffffec;
  
  VP8PutBits(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  VP8PutSignedBits(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  VP8PutSignedBits(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  VP8PutSignedBits(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  VP8PutSignedBits(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  VP8PutSignedBits(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void PutQuant(VP8BitWriter* const bw,
                     const VP8Encoder* const enc) {
  VP8PutBits(bw, enc->base_quant_, 7);
  VP8PutSignedBits(bw, enc->dq_y1_dc_, 4);
  VP8PutSignedBits(bw, enc->dq_y2_dc_, 4);
  VP8PutSignedBits(bw, enc->dq_y2_ac_, 4);
  VP8PutSignedBits(bw, enc->dq_uv_dc_, 4);
  VP8PutSignedBits(bw, enc->dq_uv_ac_, 4);
}